

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

bool __thiscall LiteScript::Namespace::DefineVariable(Namespace *this,char *name)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference __lhs;
  undefined1 local_a0 [40];
  string local_78 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_58;
  uint local_28;
  uint local_24;
  uint sz;
  uint i;
  char *name_local;
  Namespace *this_local;
  
  local_24 = 0;
  _sz = name;
  name_local = (char *)this;
  sVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::size(&this->vars);
  local_28 = (uint)sVar3;
  while( true ) {
    pcVar1 = _sz;
    if (local_28 <= local_24) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar1,(allocator *)(local_a0 + 0x27));
      Memory::Create((Memory *)local_a0,(Type *)this->memory);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
                (&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (Variable *)local_a0);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ::push_back(&this->vars,&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::~pair(&local_58);
      Variable::~Variable((Variable *)local_a0);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x27));
      return true;
    }
    __lhs = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
            ::operator[](&this->vars,(ulong)local_24);
    bVar2 = std::operator==(&__lhs->first,_sz);
    if (bVar2) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool LiteScript::Namespace::DefineVariable(const char *name) {
    for (unsigned int i = 0, sz = this->vars.size(); i < sz; i++) {
        if (this->vars[i].first == name)
            return false;
    }
    this->vars.push_back({ std::string(name), this->memory.Create(Type::NIL) });
    return true;
}